

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void check_decl_align(c2m_ctx_t c2m_ctx,decl_spec *decl_spec)

{
  int iVar1;
  pos_t pVar2;
  
  if (-1 < decl_spec->align) {
    iVar1 = decl_spec->type->align;
    if (iVar1 < 0) {
      __assert_fail("type->align >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x17a0,"int type_align(struct type *)");
    }
    if (decl_spec->align < iVar1) {
      pVar2 = get_node_pos(c2m_ctx,decl_spec->align_node);
      error(c2m_ctx,0x1c246c,pVar2.fname,pVar2._8_8_);
      return;
    }
  }
  return;
}

Assistant:

static void check_decl_align (c2m_ctx_t c2m_ctx, struct decl_spec *decl_spec) {
  if (decl_spec->align < 0) return;
  if (decl_spec->align < type_align (decl_spec->type))
    error (c2m_ctx, POS (decl_spec->align_node),
           "requested alignment is less than minimum alignment for the type");
}